

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkexmlParser.cpp
# Opt level: O1

shared_ptr<Node> __thiscall SkexmlParser::MakeNode(SkexmlParser *this,string *name,ifstream *file)

{
  Node *pNVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Alloc_hider _Var8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  shared_ptr<Node> sVar12;
  string input;
  string attribute_name;
  string child_name;
  string value;
  string local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  long local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  undefined1 *local_180;
  long local_178;
  undefined1 local_170 [16];
  string local_160;
  string local_140;
  string local_120;
  undefined1 *local_100;
  long local_f8;
  undefined1 local_f0 [16];
  string local_e0;
  string local_c0;
  SkexmlParser local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Node,std::allocator<Node>,std::__cxx11::string&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(Node **)this,
             (allocator<Node> *)&local_180,name);
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  cVar2 = (char)file;
  cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)file,(string *)&local_1c0,cVar3);
  Utils::RemoveEndline(&local_1c0);
  _Var7._M_pi = extraout_RDX;
LAB_0015498e:
  if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 2) == 0) {
    if (local_1c0._M_string_length < 2) {
      bVar10 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_1c0);
      iVar4 = std::__cxx11::string::compare((char *)local_50);
      bVar10 = iVar4 == 0;
      _Var7._M_pi = extraout_RDX_00;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
        _Var7._M_pi = extraout_RDX_01;
      }
    }
    if (!bVar10) {
      std::__cxx11::string::substr((ulong)&local_1a0,(ulong)&local_1c0);
      iVar4 = std::__cxx11::string::compare((char *)&local_1a0);
      _Var7._M_pi = extraout_RDX_02;
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
        _Var7._M_pi = extraout_RDX_03;
      }
      if (iVar4 != 0) {
        do {
          bVar10 = local_1c0._M_string_length >= 2;
          if (local_1c0._M_string_length < 2) {
LAB_00154a8c:
            bVar11 = ((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 2) == 0;
          }
          else {
            std::__cxx11::string::substr((ulong)local_70,(ulong)&local_1c0);
            iVar4 = std::__cxx11::string::compare((char *)local_70);
            _Var7._M_pi = extraout_RDX_04;
            if (iVar4 != 0) goto LAB_00154a8c;
            bVar10 = true;
            bVar11 = false;
          }
          if ((bVar10) && (local_70[0] != local_60)) {
            operator_delete(local_70[0]);
            _Var7._M_pi = extraout_RDX_05;
          }
          if (!bVar11) goto LAB_00154b94;
          pNVar1 = *(Node **)this;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"List","");
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,local_1c0._M_dataplus._M_p,
                     local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
          Node::AddListAttribute(pNVar1,&local_c0,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)file,(string *)&local_1c0,cVar3);
          Utils::RemoveEndline(&local_1c0);
          _Var7._M_pi = extraout_RDX_06;
        } while( true );
      }
      uVar9 = local_1c0._M_string_length - 1;
      uVar5 = std::__cxx11::string::find((char *)&local_1c0,0x1700b3,0);
      if (uVar5 < uVar9) {
        std::__cxx11::string::find((char *)&local_1c0,0x1700b3,0);
        std::__cxx11::string::substr((ulong)&local_1a0,(ulong)&local_1c0);
        std::__cxx11::string::find((char *)&local_1c0,0x1700b3,0);
        std::__cxx11::string::find((char *)&local_1c0,0x1700b5,0);
        std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_1c0);
        pNVar1 = *(Node **)this;
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_1a0,local_1a0->_M_local_buf + local_198);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,local_100,local_100 + local_f8);
        Node::AddAttribute(pNVar1,&local_140,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if (local_100 != local_f0) {
          operator_delete(local_100);
        }
        paVar6 = &local_190;
        _Var8._M_p = (pointer)local_1a0;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_1a0,(ulong)&local_1c0);
        std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1a0);
        if (local_1a0 != &local_190) {
          operator_delete(local_1a0);
        }
        pNVar1 = *(Node **)this;
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,local_180,local_180 + local_178);
        MakeNode(local_a0,&local_160,file);
        Node::AddChild(pNVar1,(shared_ptr<Node> *)local_a0);
        if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
        }
        paVar6 = &local_160.field_2;
        _Var8._M_p = local_160._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var8._M_p != paVar6) {
        operator_delete(_Var8._M_p);
      }
      goto LAB_00154e40;
    }
  }
LAB_00154e6f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
    _Var7._M_pi = extraout_RDX_10;
  }
  if (local_180 != local_170) {
    operator_delete(local_180);
    _Var7._M_pi = extraout_RDX_11;
  }
  sVar12.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi;
  sVar12.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Node>)sVar12.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
LAB_00154b94:
  if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 2) == 0) {
    if (local_1c0._M_string_length < 2) {
      bVar10 = false;
      bVar11 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)local_90,(ulong)&local_1c0);
      iVar4 = std::__cxx11::string::compare((char *)local_90);
      bVar11 = iVar4 == 0;
      bVar10 = true;
      _Var7._M_pi = extraout_RDX_07;
    }
  }
  else {
    bVar11 = true;
    bVar10 = false;
  }
  if ((bVar10) && (local_90[0] != local_80)) {
    operator_delete(local_90[0]);
    _Var7._M_pi = extraout_RDX_08;
  }
  if (bVar11) goto LAB_00154e6f;
LAB_00154e40:
  cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)file,(string *)&local_1c0,cVar3);
  Utils::RemoveEndline(&local_1c0);
  _Var7._M_pi = extraout_RDX_09;
  goto LAB_0015498e;
}

Assistant:

std::shared_ptr<Node> SkexmlParser::MakeNode(std::string name, std::ifstream& file) {
    std::shared_ptr<Node> node = std::make_shared<Node>(name);
    std::string child_name = "";
    std::string input = "";
    std::getline(file, input);
    Utils::RemoveEndline(input);
    while(!file.eof())
    {
        if(input.length() > 1 and input.substr(0,2) == "[/")
            return node;
        else if(input.substr(0,1) != "[") {
            while((input.length() < 2 or input.substr(0,2) != "[/") and !file.eof())
            {
                node->AddListAttribute("List", input);
                std::getline(file, input);
                Utils::RemoveEndline(input);
            }
            if(file.eof() or (input.length() > 1 and input.substr(0,2) == "[/"))
                return node;
        }
        else if(input.length() - 1 > input.find("]")) {
            std::string attribute_name = input.substr(1, input.find("]") - 1);
            unsigned long value_begin = input.find("]") + 1;
            unsigned long value_end = input.find("[/") - value_begin;
            std::string value = input.substr(value_begin, value_end);
            node->AddAttribute(attribute_name, value);
        }
        else {
            child_name = input.substr(1, input.length() - 2);
            node->AddChild(MakeNode(child_name, file));
        }
        std::getline(file, input);
        Utils::RemoveEndline(input);
    }
    return node;
}